

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IResultCapture * Catch::getResultCapture(void)

{
  undefined **ppuVar1;
  IResultCapture *pIVar2;
  long in_FS_OFFSET;
  ReusableStringStream RStack_58;
  SourceLineInfo local_40;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x30);
    ppuVar1 = &PTR__Context_001cade0;
    *IMutableContext::currentContext = &PTR__Context_001cade0;
    IMutableContext::currentContext[1] = &PTR__Context_001cae30;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
  }
  else {
    ppuVar1 = (undefined **)*IMutableContext::currentContext;
  }
  pIVar2 = (IResultCapture *)(*(code *)ppuVar1[2])();
  if (pIVar2 == (IResultCapture *)0x0) {
    ReusableStringStream::ReusableStringStream(&RStack_58);
    local_40.file =
         "/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp"
    ;
    local_40.line = 0x335f;
    operator<<(RStack_58.m_oss,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              (RStack_58.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (RStack_58.m_oss,"No result capture instance",0x1a);
    std::__cxx11::stringbuf::str();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      throw_logic_error(&local_30);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pIVar2;
  }
  __stack_chk_fail();
}

Assistant:

IResultCapture& getResultCapture() {
        if (auto* capture = getCurrentContext().getResultCapture())
            return *capture;
        else
            CATCH_INTERNAL_ERROR("No result capture instance");
    }